

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpuidpp.cpp
# Opt level: O2

string * __thiscall cpuidpp::CPUIDImpl::query_vendor_abi_cxx11_(CPUIDImpl *this)

{
  int *piVar1;
  int iVar2;
  uint value;
  uint value_00;
  uint value_01;
  string local_48;
  
  if ((this->vendor)._M_string_length == 0) {
    piVar1 = (int *)cpuid_basic_info(0);
    iVar2 = *piVar1;
    value = piVar1[1];
    value_00 = piVar1[2];
    value_01 = piVar1[3];
    if (iVar2 == 0) {
      value_00 = 0;
      value_01 = 0;
    }
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    local_48._M_string_length = 0;
    local_48.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::reserve((ulong)&local_48);
    if (iVar2 == 0) {
      value = 0;
    }
    anon_unknown_2::ExtractChar<unsigned_int,_4UL,_4UL>::fill(value,&local_48);
    anon_unknown_2::ExtractChar<unsigned_int,_4UL,_4UL>::fill(value_00,&local_48);
    anon_unknown_2::ExtractChar<unsigned_int,_4UL,_4UL>::fill(value_01,&local_48);
    std::__cxx11::string::operator=((string *)&this->vendor,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return &this->vendor;
}

Assistant:

const std::string& query_vendor() const
    {
        if (vendor.empty()) {
            std::array<unsigned, 4> info{};
            // EAX=0
            cpuid(info.data(), 0);

            vendor = ExtractCharsFromArray<1, 3, 2>::extract(info);
        }

        return vendor;
    }